

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall
soul::HEARTGenerator::addBranchIf
          (HEARTGenerator *this,Expression *condition,Block *trueBranch,Block *falseBranch,
          pool_ptr<soul::heart::Block> *subsequentBranch)

{
  Expression *condition_00;
  pool_ptr<soul::heart::Block> local_40;
  Type local_38;
  
  local_38.category = primitive;
  local_38.arrayElementCategory = invalid;
  local_38.isRef = false;
  local_38.isConstant = false;
  local_38.primitiveType.type = bool_;
  local_38.boundingSize = 0;
  local_38.arrayElementBoundingSize = 0;
  local_38.structure.object = (Structure *)0x0;
  condition_00 = evaluateAsExpression(this,condition,&local_38);
  local_40 = (pool_ptr<soul::heart::Block>)subsequentBranch->object;
  FunctionBuilder::addBranchIf(&this->builder,condition_00,trueBranch,falseBranch,&local_40);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  return;
}

Assistant:

void addBranchIf (AST::Expression& condition, heart::Block& trueBranch,
                      heart::Block& falseBranch, pool_ptr<heart::Block> subsequentBranch)
    {
        builder.addBranchIf (evaluateAsExpression (condition, PrimitiveType::bool_),
                             trueBranch, falseBranch, subsequentBranch);
    }